

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  iterator __begin4;
  string_type s;
  iterator __end4;
  undefined1 local_1e8 [32];
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [32];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  const_iterator local_140;
  iterator local_138;
  input_iterator_range<ghc::filesystem::path::iterator> local_f8;
  const_iterator local_78;
  iterator local_70;
  
  bVar3 = has_relative_path(this);
  if (bVar3) {
    sVar1 = (this->_path)._M_string_length;
    if (sVar1 == 0) {
      bVar3 = true;
    }
    else {
      local_1e8._0_8_ = (this->_path)._M_dataplus._M_p;
      local_138._first._M_current = (char *)(local_1e8._0_8_ + sVar1);
      local_f8._first._first._M_current = (char *)local_1e8._0_8_;
      iterator::iterator(&local_70,(const_iterator *)&local_f8,&local_138._first,
                         (const_iterator *)local_1e8);
      local_f8._first._first._M_current = (this->_path)._M_dataplus._M_p;
      local_1e8._0_8_ = local_f8._first._first._M_current + (this->_path)._M_string_length;
      local_188._0_8_ = local_1e8._0_8_;
      iterator::iterator(&local_138,(const_iterator *)&local_f8,(const_iterator *)local_1e8,
                         (const_iterator *)local_188);
      local_138._iter = iterator::decrement(&local_138,&local_138._iter);
      iterator::updateCurrent(&local_138);
      bVar3 = local_70._iter._M_current == local_138._iter._M_current;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._current._path._M_dataplus._M_p != &local_138._current._path.field_2) {
        operator_delete(local_138._current._path._M_dataplus._M_p,
                        local_138._current._path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
        operator_delete(local_70._current._path._M_dataplus._M_p,
                        local_70._current._path.field_2._M_allocated_capacity + 1);
      }
    }
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    if (!bVar3) {
      local_188._0_8_ = (this->_path)._M_dataplus._M_p;
      local_1a8._M_dataplus._M_p = (pointer)(local_188._0_8_ + (this->_path)._M_string_length);
      local_140._M_current = (char *)local_188._0_8_;
      iterator::iterator((iterator *)local_1e8,(const_iterator *)local_188,
                         (const_iterator *)&local_1a8,&local_140);
      local_1a8._M_dataplus._M_p = (this->_path)._M_dataplus._M_p;
      local_140._M_current = local_1a8._M_dataplus._M_p + (this->_path)._M_string_length;
      local_78._M_current = local_140._M_current;
      iterator::iterator((iterator *)local_188,(const_iterator *)&local_1a8,&local_140,&local_78);
      local_188._24_8_ =
           iterator::decrement((iterator *)local_188,(const_iterator *)(local_188 + 0x18));
      iterator::updateCurrent((iterator *)local_188);
      input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                (&local_f8,(iterator *)local_1e8,(iterator *)local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != &local_158) {
        operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != &local_1b8) {
        operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
      }
      local_1e8._16_4_ = local_f8._first._root._M_current._0_4_;
      local_1e8._20_4_ = local_f8._first._root._M_current._4_4_;
      local_1e8._24_4_ = local_f8._first._iter._M_current._0_4_;
      local_1e8._28_4_ = local_f8._first._iter._M_current._4_4_;
      local_1e8._0_8_ = local_f8._first._first._M_current;
      local_1e8._8_4_ = local_f8._first._last._M_current._0_4_;
      local_1e8._12_4_ = local_f8._first._last._M_current._4_4_;
      local_1c8._M_p = (pointer)&local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_f8._first._current._path._M_dataplus._M_p,
                 local_f8._first._current._path._M_dataplus._M_p +
                 local_f8._first._current._path._M_string_length);
      local_188._16_4_ = local_f8._last._root._M_current._0_4_;
      local_188._20_4_ = local_f8._last._root._M_current._4_4_;
      local_188._28_4_ = local_f8._last._iter._M_current._4_4_;
      local_188._24_4_ = local_f8._last._iter._M_current._0_4_;
      local_188._8_4_ = local_f8._last._last._M_current._0_4_;
      local_188._12_4_ = local_f8._last._last._M_current._4_4_;
      local_168._M_p = (pointer)&local_158;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,local_f8._last._current._path._M_dataplus._M_p,
                 local_f8._last._current._path._M_dataplus._M_p +
                 local_f8._last._current._path._M_string_length);
      while ((char *)CONCAT44(local_1e8._28_4_,local_1e8._24_4_) != (char *)local_188._24_8_) {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,local_1c8._M_p,local_1c8._M_p + local_1c0);
        iVar4 = std::__cxx11::string::compare((char *)&local_1a8);
        if (iVar4 == 0) {
          operator+=(__return_storage_ptr__,&local_1a8);
        }
        else {
          append<std::__cxx11::string>(__return_storage_ptr__,&local_1a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        iterator::operator++((iterator *)local_1e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != &local_158) {
        operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != &local_1b8) {
        operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._last._current._path._M_dataplus._M_p !=
          &local_f8._last._current._path.field_2) {
        operator_delete(local_f8._last._current._path._M_dataplus._M_p,
                        local_f8._last._current._path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._first._current._path._M_dataplus._M_p !=
          &local_f8._first._current._path.field_2) {
        operator_delete(local_f8._first._current._path._M_dataplus._M_p,
                        local_f8._first._current._path.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    pcVar2 = (this->_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->_path)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::parent_path() const
{
    if (has_relative_path()) {
        if (empty() || begin() == --end()) {
            return path();
        }
        else {
            path pp;
            for (string_type s : input_iterator_range<iterator>(begin(), --end())) {
                if (s == "/") {
                    // don't use append to join a path-
                    pp += s;
                }
                else {
                    pp /= s;
                }
            }
            return pp;
        }
    }
    else {
        return *this;
    }
}